

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O1

result_type_conflict3 * __thiscall
trng::chi_square_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,chi_square_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 <= x._0_10_) {
    powl();
    lgammal();
    in_RAX = (result_type_conflict3 *)expl();
  }
  return in_RAX;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= 2;
      return math::pow(x, P.nu() / result_type(2) - 1) /
             (math::exp(x + math::ln_Gamma(P.nu() / result_type(2))) * 2);
    }